

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O3

void __thiscall
duckdb::SplitStringListOperation::HandleValue
          (SplitStringListOperation *this,char *buf,idx_t start,idx_t end)

{
  string_t *psVar1;
  idx_t iVar2;
  bool bVar3;
  string_t sVar4;
  
  if (start + 4 == end) {
    bVar3 = StringUtil::CIEquals(buf + start,4,"null",4);
    if (bVar3) {
      FlatVector::SetNull(this->child,*this->entry_count,true);
      goto LAB_00fee620;
    }
  }
  sVar4 = HandleString<true>(this->child,buf,start,end);
  psVar1 = this->child_data;
  iVar2 = *this->entry_count;
  *(long *)&psVar1[iVar2].value = sVar4.value._0_8_;
  psVar1[iVar2].value.pointer.ptr = sVar4.value._8_8_;
LAB_00fee620:
  *this->entry_count = *this->entry_count + 1;
  return;
}

Assistant:

void HandleValue(const char *buf, idx_t start, idx_t end) {
		if (IsNull(buf, start, end)) {
			FlatVector::SetNull(child, entry_count, true);
			entry_count++;
			return;
		}
		child_data[entry_count] = HandleString(child, buf, start, end);
		entry_count++;
	}